

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QFont>_>::rehash
          (Data<QHashPrivate::Node<QByteArray,_QFont>_> *this,size_t sizeHint)

{
  Entry *key;
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  char *pcVar5;
  qsizetype qVar6;
  ulong uVar7;
  Node<QByteArray,_QFont> *pNVar8;
  ulong uVar9;
  Span *pSVar10;
  size_t index;
  long lVar11;
  size_t sVar12;
  long lVar13;
  R RVar14;
  Bucket BVar15;
  QByteArrayView QVar16;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  sVar12 = 0x80;
  if ((0x40 < sizeHint) && (sVar12 = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar11 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    sVar12 = 1L << (0x41 - ((byte)lVar11 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar14 = allocateSpans(sVar12);
  this->spans = (Span *)RVar14.spans;
  this->numBuckets = sVar12;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar9 = 0;
    pSVar10 = pSVar2;
    do {
      lVar11 = 0;
      do {
        uVar7 = (ulong)pSVar10->offsets[lVar11];
        if (uVar7 != 0xff) {
          pEVar3 = pSVar2[uVar9].entries;
          key = pEVar3 + uVar7;
          QVar16.m_data = *(char **)((long)(key->storage).data + 8);
          QVar16.m_size = *(qsizetype *)((long)(key->storage).data + 0x10);
          sVar12 = qHash(QVar16,this->seed);
          BVar15 = findBucketWithHash<QByteArray>(this,(QByteArray *)key,sVar12);
          pNVar8 = Span<QHashPrivate::Node<QByteArray,_QFont>_>::insert(BVar15.span,BVar15.index);
          pDVar4 = *(Data **)(key->storage).data;
          *(Data **)(key->storage).data = (Data *)0x0;
          (pNVar8->key).d.d = pDVar4;
          pcVar5 = *(char **)((long)(key->storage).data + 8);
          *(char **)((long)(key->storage).data + 8) = (char *)0x0;
          (pNVar8->key).d.ptr = pcVar5;
          qVar6 = *(qsizetype *)((long)(key->storage).data + 0x10);
          *(qsizetype *)((long)(key->storage).data + 0x10) = 0;
          (pNVar8->key).d.size = qVar6;
          QFont::QFont(&pNVar8->value,(QFont *)(pEVar3[uVar7].storage.data + 0x18));
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x80);
      Span<QHashPrivate::Node<QByteArray,_QFont>_>::freeData(pSVar2 + uVar9);
      uVar9 = uVar9 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar9 != uVar1 >> 7);
  }
  lVar11 = *(long *)&pSVar2[-1].allocated;
  if (lVar11 != 0) {
    lVar13 = lVar11 * 0x90;
    do {
      Span<QHashPrivate::Node<QByteArray,_QFont>_>::freeData
                ((Span<QHashPrivate::Node<QByteArray,_QFont>_> *)(pSVar2[-1].offsets + lVar13));
      lVar13 = lVar13 + -0x90;
    } while (lVar13 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar11 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }